

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::basic_inode_4(basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                *this,db_type *param_1,key_view k1,art_key_type shifted_k2,tree_depth_type depth,
               leaf_type *child1,db_leaf_unique_ptr *child2)

{
  db_type *param_1_local;
  basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  tree_depth_type depth_local;
  art_key_type shifted_k2_local;
  key_view k1_local;
  
  basic_inode<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>,_2U,_4U,_(unodb::node_type)1,_unodb::detail::fake_inode,_unodb::detail::inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::basic_inode((basic_inode<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>,_2U,_4U,_(unodb::node_type)1,_unodb::detail::fake_inode,_unodb::detail::inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)this,k1,shifted_k2,
                (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                 )depth.value);
  key_union::key_union((key_union *)&(this->keys).byte_array);
  init(this,(EVP_PKEY_CTX *)k1._M_ptr);
  return;
}

Assistant:

constexpr basic_inode_4(db_type &, key_view k1, art_key_type shifted_k2,
                          tree_depth_type depth, leaf_type *child1,
                          db_leaf_unique_ptr &&child2) noexcept
      : parent_class{k1, shifted_k2, depth} {
    init(k1, shifted_k2, depth, child1, std::move(child2));
  }